

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

char16_t * __thiscall kj::Vector<char16_t>::add<char16_t&>(Vector<char16_t> *this,char16_t *params)

{
  char16_t *pcVar1;
  
  pcVar1 = (this->builder).pos;
  if (pcVar1 == (this->builder).endPtr) {
    grow(this,0);
    pcVar1 = (this->builder).pos;
  }
  *pcVar1 = *params;
  (this->builder).pos = pcVar1 + 1;
  return pcVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }